

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O2

void __thiscall GlobOptBlockData::SetValue(GlobOptBlockData *this,Value *val,Sym *sym)

{
  Sym *this_00;
  StackSym *pSVar1;
  Value **ppVVar2;
  
  this_00 = GlobOpt::SetSymStore(this->globOpt,val->valueInfo,sym);
  if (this_00->m_kind == SymKindStack) {
    pSVar1 = Sym::AsStackSym(this_00);
    if ((pSVar1->field_0x1a & 4) != 0) {
      SparseArray<Value>::Set(this->globOpt->byteCodeConstantValueArray,this_00->m_id,val);
      BVSparse<Memory::JitArenaAllocator>::Set
                (this->globOpt->byteCodeConstantValueNumbersBv,val->valueNumber);
      return;
    }
  }
  ppVVar2 = ValueHashTable<Sym_*,_Value_*>::FindOrInsertNew(this->symToValueMap,this_00);
  *ppVVar2 = val;
  SetChangedSym(this,this_00);
  return;
}

Assistant:

void
GlobOptBlockData::SetValue(Value *val, Sym * sym)
{
    ValueInfo *valueInfo = val->GetValueInfo();

    sym = this->globOpt->SetSymStore(valueInfo, sym);
    bool isStackSym = sym->IsStackSym();

    if (isStackSym && sym->AsStackSym()->IsFromByteCodeConstantTable())
    {
        // Put the constants in a global array. This will minimize the per-block info.
        this->globOpt->byteCodeConstantValueArray->Set(sym->m_id, val);
        this->globOpt->byteCodeConstantValueNumbersBv->Set(val->GetValueNumber());
    }
    else
    {
        this->SetValueToHashTable(this->symToValueMap, val, sym);
        this->SetChangedSym(sym);
    }
}